

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::hkdf_hmac_sha256_l32_tests::test_method(hkdf_hmac_sha256_l32_tests *this)

{
  long in_FS_OFFSET;
  allocator<char> local_94;
  allocator<char> local_93;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b",&local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"000102030405060708090a0b0c",&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"f0f1f2f3f4f5f6f7f8f9",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"3cb25f25faacd57a90434f64d0362f2a2d2d0a90cf1a5a4c5db02d56ecc4c5bf",
             &local_94);
  CryptoTest::TestHKDF_SHA256_32
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f202122232425262728292a2b2c2d2e2f303132333435363738393a3b3c3d3e3f404142434445464748494a4b4c4d4e4f"
             ,&local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "606162636465666768696a6b6c6d6e6f707172737475767778797a7b7c7d7e7f808182838485868788898a8b8c8d8e8f909192939495969798999a9b9c9d9e9fa0a1a2a3a4a5a6a7a8a9aaabacadaeaf"
             ,&local_92);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "b0b1b2b3b4b5b6b7b8b9babbbcbdbebfc0c1c2c3c4c5c6c7c8c9cacbcccdcecfd0d1d2d3d4d5d6d7d8d9dadbdcdddedfe0e1e2e3e4e5e6e7e8e9eaebecedeeeff0f1f2f3f4f5f6f7f8f9fafbfcfdfeff"
             ,&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"b11e398dc80327a1c8e7f78c596a49344f012eda2d4efad8a050cc4c19afa97c",
             &local_94);
  CryptoTest::TestHKDF_SHA256_32
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b",&local_91);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_92);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_93);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"8da4e775a563c18f715f802a063c5a31b8a11f5c5ee1879ec3454e5f3c738d2d",
             &local_94);
  CryptoTest::TestHKDF_SHA256_32
            (&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,&local_30,&local_50,&local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(hkdf_hmac_sha256_l32_tests)
{
    // Use rfc5869 test vectors but truncated to 32 bytes (our implementation only support length 32)
    TestHKDF_SHA256_32(
                /*ikm_hex=*/"0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b",
                /*salt_hex=*/"000102030405060708090a0b0c",
                /*info_hex=*/"f0f1f2f3f4f5f6f7f8f9",
                /*okm_check_hex=*/"3cb25f25faacd57a90434f64d0362f2a2d2d0a90cf1a5a4c5db02d56ecc4c5bf");
    TestHKDF_SHA256_32(
                "000102030405060708090a0b0c0d0e0f101112131415161718191a1b1c1d1e1f202122232425262728292a2b2c2d2e2f303132333435363738393a3b3c3d3e3f404142434445464748494a4b4c4d4e4f",
                "606162636465666768696a6b6c6d6e6f707172737475767778797a7b7c7d7e7f808182838485868788898a8b8c8d8e8f909192939495969798999a9b9c9d9e9fa0a1a2a3a4a5a6a7a8a9aaabacadaeaf",
                "b0b1b2b3b4b5b6b7b8b9babbbcbdbebfc0c1c2c3c4c5c6c7c8c9cacbcccdcecfd0d1d2d3d4d5d6d7d8d9dadbdcdddedfe0e1e2e3e4e5e6e7e8e9eaebecedeeeff0f1f2f3f4f5f6f7f8f9fafbfcfdfeff",
                "b11e398dc80327a1c8e7f78c596a49344f012eda2d4efad8a050cc4c19afa97c");
    TestHKDF_SHA256_32(
                "0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b0b",
                "",
                "",
                "8da4e775a563c18f715f802a063c5a31b8a11f5c5ee1879ec3454e5f3c738d2d");
}